

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

bool __thiscall TypeInfo::operator<(TypeInfo *this,TypeInfo *rhs)

{
  bool bVar1;
  __type_conflict _Var2;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_1f;
  __unspec local_1e;
  type local_1d;
  __unspec local_1c;
  type local_1b;
  __unspec local_1a;
  type local_19;
  TypeInfo *local_18;
  TypeInfo *rhs_local;
  TypeInfo *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  local_19 = (type)std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                             (&this->prefix,&rhs->prefix);
  std::__cmp_cat::__unspec::__unspec(&local_1a,(__unspec *)0x0);
  bVar1 = std::operator<(local_19);
  local_1f = true;
  if (!bVar1) {
    _Var2 = std::operator==(&this->prefix,&local_18->prefix);
    local_29 = false;
    if (_Var2) {
      local_1b = (type)std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                                 (&this->type,&local_18->type);
      std::__cmp_cat::__unspec::__unspec(&local_1c,(__unspec *)0x0);
      bVar1 = std::operator<(local_1b);
      local_2a = true;
      if (!bVar1) {
        _Var2 = std::operator==(&this->type,&local_18->type);
        local_2b = false;
        if (_Var2) {
          local_1d = (type)std::operator<=><char,std::char_traits<char>,std::allocator<char>>
                                     (&this->postfix,&local_18->postfix);
          std::__cmp_cat::__unspec::__unspec(&local_1e,(__unspec *)0x0);
          local_2b = std::operator<(local_1d);
        }
        local_2a = local_2b;
      }
      local_29 = local_2a;
    }
    local_1f = local_29;
  }
  return local_1f;
}

Assistant:

bool operator<( TypeInfo const & rhs ) const noexcept
  {
    return ( prefix < rhs.prefix ) || ( ( prefix == rhs.prefix ) && ( ( type < rhs.type ) || ( ( type == rhs.type ) && ( postfix < rhs.postfix ) ) ) );
  }